

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O2

Fxu_HeapSingle * Fxu_HeapSingleStart(void)

{
  Fxu_HeapSingle *pFVar1;
  Fxu_Single **ppFVar2;
  
  pFVar1 = (Fxu_HeapSingle *)calloc(1,0x18);
  pFVar1->nItemsAlloc = 2000;
  ppFVar2 = (Fxu_Single **)malloc(0x3ed0);
  pFVar1->pTree = ppFVar2;
  *ppFVar2 = (Fxu_Single *)0x0;
  return pFVar1;
}

Assistant:

Fxu_HeapSingle * Fxu_HeapSingleStart()
{
    Fxu_HeapSingle * p;
    p = ABC_ALLOC( Fxu_HeapSingle, 1 );
    memset( p, 0, sizeof(Fxu_HeapSingle) );
    p->nItems      = 0;
    p->nItemsAlloc = 2000;
    p->pTree       = ABC_ALLOC( Fxu_Single *, p->nItemsAlloc + 10 );
    p->pTree[0]    = NULL;
    return p;
}